

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::
     log<char_const(&)[42],unsigned_long&,kj::CappedArray<char,5ul>,kj::CappedArray<char,5ul>>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [42],
               unsigned_long *params_1,CappedArray<char,_5UL> *params_2,
               CappedArray<char,_5UL> *params_3)

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ArrayPtr<kj::String> argValues;
  undefined4 in_register_00000014;
  unsigned_long *params_00;
  long lVar5;
  String *result;
  undefined4 in_stack_ffffffffffffff58;
  String local_98;
  String local_80;
  String local_68;
  String local_50;
  
  str<char_const(&)[42]>
            (&local_98,(kj *)params,(char (*) [42])CONCAT44(in_register_00000014,severity));
  str<unsigned_long&>(&local_80,(kj *)params_1,params_00);
  sVar1 = params_2->currentSize;
  heapString(&local_68,sVar1);
  if (sVar1 != 0) {
    if ((char *)local_68.content.size_ != (char *)0x0) {
      local_68.content.size_ = (size_t)local_68.content.ptr;
    }
    memcpy((void *)local_68.content.size_,params_2->content,sVar1);
  }
  sVar1 = params_3->currentSize;
  heapString(&local_50,sVar1);
  if (sVar1 != 0) {
    if ((char *)local_50.content.size_ != (char *)0x0) {
      local_50.content.size_ = (size_t)local_50.content.ptr;
    }
    memcpy((void *)local_50.content.size_,params_3->content,sVar1);
  }
  argValues.ptr._4_4_ = severity;
  argValues.ptr._0_4_ = in_stack_ffffffffffffff58;
  argValues.size_ = (size_t)macroArgs;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_98,argValues);
  lVar5 = 0x48;
  do {
    lVar2 = *(long *)((long)&local_98.content.ptr + lVar5);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)((long)&local_98.content.size_ + lVar5);
      *(undefined8 *)((long)&local_98.content.ptr + lVar5) = 0;
      *(undefined8 *)((long)&local_98.content.size_ + lVar5) = 0;
      puVar4 = *(undefined8 **)((long)&local_98.content.disposer + lVar5);
      (**(code **)*puVar4)(puVar4,lVar2,1,uVar3,uVar3,0);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}